

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::Clear(ImDrawData *this)

{
  this->Valid = false;
  this->TotalVtxCount = 0;
  this->CmdListsCount = 0;
  this->TotalIdxCount = 0;
  ImVector<ImDrawList_*>::resize(&this->CmdLists,0);
  (this->FramebufferScale).x = 0.0;
  (this->FramebufferScale).y = 0.0;
  this->OwnerViewport = (ImGuiViewport *)0x0;
  (this->DisplayPos).x = 0.0;
  (this->DisplayPos).y = 0.0;
  (this->DisplaySize).x = 0.0;
  (this->DisplaySize).y = 0.0;
  return;
}

Assistant:

void ImDrawData::Clear()
{
    Valid = false;
    CmdListsCount = TotalIdxCount = TotalVtxCount = 0;
    CmdLists.resize(0); // The ImDrawList are NOT owned by ImDrawData but e.g. by ImGuiContext, so we don't clear them.
    DisplayPos = DisplaySize = FramebufferScale = ImVec2(0.0f, 0.0f);
    OwnerViewport = NULL;
}